

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O2

void __thiscall Buffer::Members::Members(Members *this,size_t size,uchar *buf,bool own_memory)

{
  undefined3 in_register_00000009;
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  this->own_memory = own_memory;
  this->size = size;
  this->buf = (uchar *)0x0;
  if (CONCAT31(in_register_00000009,own_memory) != 0) {
    if (size == 0) {
      buf = (uchar *)0x0;
    }
    else {
      buf = (uchar *)operator_new__(size);
    }
  }
  this->buf = buf;
  return;
}

Assistant:

Buffer::Members::Members(size_t size, unsigned char* buf, bool own_memory) :
    own_memory(own_memory),
    size(size),
    buf(nullptr)
{
    if (own_memory) {
        this->buf = (size ? new unsigned char[size] : nullptr);
    } else {
        this->buf = buf;
    }
}